

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::RenderGridLinesX
               (ImDrawList *DrawList,ImPlotTickCollection *ticks,ImRect *rect,ImU32 col_maj,
               ImU32 col_min,float size_maj,float size_min)

{
  int iVar1;
  ImU32 col;
  float fVar2;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImPlotTick *local_50;
  ImPlotTick *xt;
  int t;
  ImVec4 col_min4;
  float density;
  float size_min_local;
  float size_maj_local;
  ImU32 col_min_local;
  ImU32 col_maj_local;
  ImRect *rect_local;
  ImPlotTickCollection *ticks_local;
  ImDrawList *DrawList_local;
  
  iVar1 = ticks->Size;
  col_min4.w = size_min;
  fVar2 = ImRect::GetWidth(rect);
  col_min4.z = (float)iVar1 / fVar2;
  join_0x00001240_0x00001200_ = ImGui::ColorConvertU32ToFloat4(col_min);
  fVar2 = ImRemap<float>(col_min4.z,0.1,0.2,1.0,0.0);
  fVar2 = ImClamp<float>(fVar2,0.0,1.0);
  col_min4.y = fVar2 * col_min4.y;
  col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)((long)&xt + 4));
  for (xt._0_4_ = 0; (int)xt < ticks->Size; xt._0_4_ = (int)xt + 1) {
    local_50 = ImVector<ImPlotTick>::operator[](&ticks->Ticks,(int)xt);
    if (local_50->Level == 0) {
      if ((local_50->Major & 1U) == 0) {
        if (col_min4.z < 0.2) {
          ImVec2::ImVec2(&local_68,local_50->PixelPos,(rect->Min).y);
          ImVec2::ImVec2(&local_70,local_50->PixelPos,(rect->Max).y);
          ImDrawList::AddLine(DrawList,&local_68,&local_70,col,col_min4.w);
        }
      }
      else {
        ImVec2::ImVec2(&local_58,local_50->PixelPos,(rect->Min).y);
        ImVec2::ImVec2(&local_60,local_50->PixelPos,(rect->Max).y);
        ImDrawList::AddLine(DrawList,&local_58,&local_60,col_maj,size_maj);
      }
    }
  }
  return;
}

Assistant:

static inline void RenderGridLinesX(ImDrawList& DrawList, const ImPlotTickCollection& ticks, const ImRect& rect, ImU32 col_maj, ImU32 col_min, float size_maj, float size_min) {
    const float density   = ticks.Size / rect.GetWidth();
    ImVec4 col_min4  = ImGui::ColorConvertU32ToFloat4(col_min);
    col_min4.w      *= ImClamp(ImRemap(density, 0.1f, 0.2f, 1.0f, 0.0f), 0.0f, 1.0f);
    col_min = ImGui::ColorConvertFloat4ToU32(col_min4);
    for (int t = 0; t < ticks.Size; t++) {
        const ImPlotTick& xt = ticks.Ticks[t];
        if (xt.Level == 0) {
            if (xt.Major)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_maj, size_maj);
            else if (density < 0.2f)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_min, size_min);
        }
    }
}